

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O3

void __thiscall
nv::FloatImage::applyKernelHorizontal
          (FloatImage *this,PolyphaseKernel *k,int y,uint c,uint a,WrapMode wm,float *output)

{
  float fVar1;
  ushort uVar2;
  uint uVar3;
  float *pfVar4;
  float *pfVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  int local_50;
  
  uVar8 = (ulong)k->m_length;
  if (uVar8 != 0) {
    uVar3 = k->m_windowSize;
    uVar2 = this->m_width;
    uVar20 = (uint)this->m_height;
    iVar6 = uVar20 * uVar2;
    fVar1 = k->m_width;
    pfVar4 = this->m_mem;
    uVar13 = 0;
    if (0 < y) {
      uVar13 = y;
    }
    if (this->m_height <= uVar13) {
      uVar13 = uVar20 - 1;
    }
    uVar18 = (uint)uVar2;
    uVar7 = y;
    if (uVar20 == 1) {
      uVar7 = 0;
    }
    uVar10 = -uVar7;
    if (0 < (int)uVar7) {
      uVar10 = uVar7;
    }
    pfVar5 = k->m_data;
    uVar12 = 0;
    do {
      fVar21 = NAN;
      if (0 < (int)uVar3) {
        fVar22 = floorf(((float)(uVar12 & 0xffffffff) + 0.5) * (1.0 / ((float)uVar8 / (float)uVar2))
                        - fVar1);
        local_50 = (int)uVar12;
        fVar21 = 0.0;
        uVar17 = 0;
        fVar23 = 0.0;
        do {
          uVar16 = uVar17 + (long)(int)fVar22;
          uVar19 = (uint)uVar2;
          uVar7 = (uint)uVar16;
          if (wm == WrapMode_Repeat) {
            if (y < 0) {
              uVar11 = ~((uint)~y % uVar20) + uVar20;
            }
            else {
              uVar11 = (uint)y % uVar20;
            }
            if ((long)uVar16 < 0) {
              iVar15 = ~(~uVar7 % uVar18) + uVar18;
            }
            else {
              iVar15 = (int)((uVar16 & 0xffffffff) % (ulong)uVar18);
            }
            iVar15 = uVar11 * uVar19 + iVar15;
          }
          else if (wm == WrapMode_Clamp) {
            if ((int)uVar7 < 1) {
              uVar7 = 0;
            }
            if (uVar19 <= uVar7) {
              uVar7 = uVar2 - 1;
            }
            iVar15 = uVar7 + uVar13 * uVar18;
          }
          else {
            uVar16 = uVar16 & 0xffffffff;
            if (uVar2 == 1) {
              uVar16 = 0;
            }
            uVar9 = (ulong)(uint)-(int)uVar16;
            if (0 < (int)uVar16) {
              uVar9 = uVar16;
            }
            while (uVar11 = (uint)uVar9, uVar7 = uVar10, uVar19 <= uVar11) {
              uVar11 = ((uint)uVar2 * 2 + -2) - uVar11;
              uVar7 = -uVar11;
              if (0 < (int)uVar11) {
                uVar7 = uVar11;
              }
              uVar9 = (ulong)uVar7;
            }
            while (uVar20 <= uVar7) {
              uVar14 = (uVar20 * 2 + -2) - uVar7;
              uVar7 = -uVar14;
              if (0 < (int)uVar14) {
                uVar7 = uVar14;
              }
            }
            iVar15 = uVar7 * uVar19 + uVar11;
          }
          fVar24 = (pfVar4[(ulong)(iVar6 * a) + (long)iVar15] + 0.00390625) *
                   pfVar5[uVar3 * local_50 + (int)uVar17];
          fVar23 = fVar23 + fVar24;
          fVar21 = fVar21 + fVar24 * pfVar4[(ulong)(c * iVar6) + (long)iVar15];
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar3);
        fVar21 = fVar21 / fVar23;
      }
      output[uVar12] = fVar21;
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar8);
  }
  return;
}

Assistant:

void FloatImage::applyKernelHorizontal(const PolyphaseKernel & k, int y, uint c, uint a, WrapMode wm, float * __restrict output) const
{
	const uint length = k.length();
	const float scale = float(length) / float(m_width);
	const float iscale = 1.0f / scale;

	const float width = k.width();
	const int windowSize = k.windowSize();

	const float * channel = this->channel(c);
	const float * alpha = this->channel(a);

	for (uint i = 0; i < length; i++)
	{
		const float center = (0.5f + i) * iscale;
		
		const int left = (int)floorf(center - width);
		const int right = (int)ceilf(center + width);
		nvDebugCheck(right - left <= windowSize);
		
		float norm = 0.0f;
		float sum = 0;
		for (int j = 0; j < windowSize; ++j)
		{
			const int idx = this->index(left + j, y, wm);

			float w = k.valueAt(i, j) * (alpha[idx] + (1.0f / 256.0f));
			norm += w;
			sum += w * channel[idx];
		}
		
		output[i] = sum / norm;
	}
}